

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
          ScratchAllocator *alloc,DynamicStateInfo *dynamic_state_info)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  void *__dest;
  size_t size;
  
  puVar5 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (puVar5 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar1 = create_info->pNext;
    uVar3 = *(undefined8 *)&create_info->flags;
    uVar4 = *(undefined8 *)&create_info->discardRectangleCount;
    puVar5[4] = create_info->pDiscardRectangles;
    puVar5[2] = uVar3;
    puVar5[3] = uVar4;
    *puVar5 = uVar2;
    puVar5[1] = pvVar1;
  }
  if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
     (dynamic_state_info->discard_rectangle == true)) {
    puVar5[4] = 0;
    return puVar5;
  }
  if ((ulong)*(uint *)(puVar5 + 3) != 0) {
    pvVar1 = (void *)puVar5[4];
    size = (ulong)*(uint *)(puVar5 + 3) << 4;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar1,size);
      goto LAB_001251f0;
    }
  }
  __dest = (void *)0x0;
LAB_001251f0:
  puVar5[4] = __dest;
  return puVar5;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	auto *discard_rectangles = copy(create_info, 1, alloc);
	if (dynamic_state_info && dynamic_state_info->discard_rectangle)
		discard_rectangles->pDiscardRectangles = nullptr;
	else
		discard_rectangles->pDiscardRectangles = copy(discard_rectangles->pDiscardRectangles, discard_rectangles->discardRectangleCount, alloc);
	return discard_rectangles;
}